

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this;
  char cVar2;
  _Head_base<0UL,_llvm::Module_*,_false> m;
  long lVar3;
  pointer __p;
  raw_ostream *prVar4;
  int iVar5;
  StringRef SVar6;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  MemorySSADumper dumper;
  LLVMContext context;
  TimeMeasure tm;
  LLVMDataDependenceAnalysis DDA;
  DGLLVMPointerAnalysis PTA;
  SlicerOptions options;
  _Head_base<0UL,_llvm::Module_*,_false> local_558;
  string local_550;
  undefined1 local_520 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_510;
  undefined1 local_500 [184];
  __uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
  local_448;
  LLVMPointerAnalysisOptions local_440;
  DGLLVMPointerAnalysis local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  undefined1 local_320 [24];
  _Link_type local_308;
  size_type local_2e8;
  undefined1 local_2e0 [24];
  _Link_type local_2c8;
  undefined1 local_2a8;
  SlicerOptions local_2a0;
  
  setupStackTraceOnError(argc,argv);
  iVar5 = 1;
  parseSlicerOptions((int)&local_2a0,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_520);
  parseModule((char *)&local_558,(LLVMContext *)"llvm-dda-dump",(SlicerOptions *)local_520);
  if (local_558._M_head_impl == (Module *)0x0) goto LAB_0010ef94;
  SVar6.Length = (size_t)local_2a0.dgOptions.entryFunction._M_dataplus._M_p;
  SVar6.Data = (char *)local_558._M_head_impl;
  lVar3 = llvm::Module::getFunction(SVar6);
  m._M_head_impl = local_558._M_head_impl;
  if (lVar3 == 0) {
    prVar4 = (raw_ostream *)llvm::errs();
    Str.Length = 0x1e;
    Str.Data = "The entry function not found: ";
    prVar4 = llvm::raw_ostream::operator<<(prVar4,Str);
    prVar4 = (raw_ostream *)
             llvm::raw_ostream::write
                       ((char *)prVar4,(ulong)local_2a0.dgOptions.entryFunction._M_dataplus._M_p);
    Str_00.Length = 1;
    Str_00.Data = "\n";
    llvm::raw_ostream::operator<<(prVar4,Str_00);
    goto LAB_0010ef94;
  }
  local_520._8_8_ = 0;
  aStack_510._M_allocated_capacity = 0;
  paVar1 = &local_440.super_LLVMAnalysisOptions.entryFunction.field_2;
  local_440.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_440,
             local_2a0.dgOptions.PTAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p
             ,local_2a0.dgOptions.PTAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus.
              _M_p + local_2a0.dgOptions.PTAOptions.super_LLVMAnalysisOptions.entryFunction.
                     _M_string_length);
  local_440.super_PointerAnalysisOptions.super_AnalysisOptions.fieldSensitivity.offset =
       local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions.super_AnalysisOptions.
       fieldSensitivity.offset;
  this = &local_440.super_PointerAnalysisOptions.super_AnalysisOptions.allocationFunctions;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&this->_M_t,
             &local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions.super_AnalysisOptions.
              allocationFunctions._M_t);
  local_440.super_PointerAnalysisOptions.preprocessGeps =
       local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions.preprocessGeps;
  local_440.super_PointerAnalysisOptions.invalidateNodes =
       local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions.invalidateNodes;
  local_440.super_PointerAnalysisOptions._58_6_ =
       local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions._58_6_;
  local_440.super_PointerAnalysisOptions.maxIterations =
       local_2a0.dgOptions.PTAOptions.super_PointerAnalysisOptions.maxIterations;
  local_440.analysisType = local_2a0.dgOptions.PTAOptions.analysisType;
  local_440.threads = local_2a0.dgOptions.PTAOptions.threads;
  dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis(&local_3d0,m._M_head_impl,&local_440);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&this->_M_t,
             (_Link_type)
             local_440.super_PointerAnalysisOptions.super_AnalysisOptions.allocationFunctions._M_t.
             _M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p != paVar1) {
    operator_delete(local_440.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,
                    (ulong)(local_440.super_LLVMAnalysisOptions.entryFunction.field_2.
                            _M_allocated_capacity + 1));
  }
  local_520._8_8_ = std::chrono::_V2::steady_clock::now();
  dg::DGLLVMPointerAnalysis::run(&local_3d0);
  aStack_510._M_allocated_capacity = std::chrono::_V2::steady_clock::now();
  local_500._0_8_ = local_500 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_500,"INFO: Pointer analysis took","");
  dg::debug::TimeMeasure::report
            ((TimeMeasure *)(local_520 + 8),(string *)local_500,(ostream *)&std::cerr);
  if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
    operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
  }
  local_520._8_8_ = std::chrono::_V2::steady_clock::now();
  local_340._M_allocated_capacity = (size_type)&local_330;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,
             local_2a0.dgOptions.DDAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p
             ,local_2a0.dgOptions.DDAOptions.super_LLVMAnalysisOptions.entryFunction._M_dataplus.
              _M_p + local_2a0.dgOptions.DDAOptions.super_LLVMAnalysisOptions.entryFunction.
                     _M_string_length);
  local_320._0_8_ =
       local_2a0.dgOptions.DDAOptions.super_DataDependenceAnalysisOptions.super_AnalysisOptions.
       fieldSensitivity.offset;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
              *)(local_320 + 8),
             &local_2a0.dgOptions.DDAOptions.super_DataDependenceAnalysisOptions.
              super_AnalysisOptions.allocationFunctions._M_t);
  local_2e0[0] = local_2a0.dgOptions.DDAOptions.super_DataDependenceAnalysisOptions.fieldInsensitive
  ;
  local_2e8._0_4_ = local_2a0.dgOptions.DDAOptions.super_DataDependenceAnalysisOptions.analysisType;
  local_2e8._4_4_ =
       local_2a0.dgOptions.DDAOptions.super_DataDependenceAnalysisOptions.undefinedFunsBehavior;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
  ::_Rb_tree((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
              *)(local_2e0 + 8),
             &local_2a0.dgOptions.DDAOptions.super_DataDependenceAnalysisOptions.functionModels._M_t
            );
  local_2a8 = local_2a0.dgOptions.DDAOptions.threads;
  dg::dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis
            ((LLVMDataDependenceAnalysis *)local_500,local_558._M_head_impl,
             &local_3d0.super_LLVMPointerAnalysis,(LLVMDataDependenceAnalysisOptions *)&local_340);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
  ::_M_erase((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
              *)(local_2e0 + 8),local_2c8);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
              *)(local_320 + 8),local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_allocated_capacity != &local_330) {
    operator_delete((void *)local_340._M_allocated_capacity,
                    (ulong)(local_330._M_allocated_capacity + 1));
  }
  if (graph_only[0x80] == '\x01') {
    __p = (pointer)dg::dda::LLVMDataDependenceAnalysis::createDDA();
    std::
    __uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
    ::reset(&local_448,__p);
  }
  else {
    dg::dda::LLVMDataDependenceAnalysis::run((LLVMDataDependenceAnalysis *)local_500);
  }
  aStack_510._M_allocated_capacity = std::chrono::_V2::steady_clock::now();
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_550,"INFO: Data dependence analysis took","");
  dg::debug::TimeMeasure::report((TimeMeasure *)(local_520 + 8),&local_550,(ostream *)&std::cerr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,
                    CONCAT71(local_550.field_2._M_allocated_capacity._1_7_,
                             local_550.field_2._M_local_buf[0]) + 1);
  }
  if (dump_c_lines[0x80] == '\x01') {
    allocasToVars((Module *)&local_550);
    std::
    map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
    ::operator=(&valuesToVars,
                (map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                 *)&local_550);
    std::
    _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
    ::_M_erase((_Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                *)&local_550,
               (_Link_type)
               CONCAT71(local_550.field_2._M_allocated_capacity._1_7_,
                        local_550.field_2._M_local_buf[0]));
    if (valuesToVars._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      prVar4 = (raw_ostream *)llvm::errs();
      Str_01.Length = 0x29;
      Str_01.Data = "WARNING: No debugging information found, ";
      prVar4 = llvm::raw_ostream::operator<<(prVar4,Str_01);
      Str_02.Length = 0x25;
      Str_02.Data = "the C lines output will be corrupted\n";
      llvm::raw_ostream::operator<<(prVar4,Str_02);
    }
  }
  cVar2 = todot[0x80];
  if (local_500._104_4_ == 0) {
    if (graph_only[0x80] == '\0') {
      dg::dda::MemorySSATransformation::computeAllDefinitions();
    }
    if (quiet[0x80] == '\0') {
      local_550._M_dataplus._M_p = (pointer)&PTR_dumpBBlockDefinitions_0011dc18;
      goto LAB_0010ef2d;
    }
  }
  else {
    local_550._M_dataplus._M_p = (pointer)&PTR_dumpBBlockDefinitions_0011dc38;
LAB_0010ef2d:
    local_550.field_2._M_local_buf[0] = cVar2;
    local_550._M_string_length = (size_type)local_500;
    if (cVar2 == '\0') {
      Dumper::dumpToTty((Dumper *)&local_550);
    }
    else {
      Dumper::dumpToDot((Dumper *)&local_550);
    }
  }
  dg::dda::LLVMDataDependenceAnalysis::~LLVMDataDependenceAnalysis
            ((LLVMDataDependenceAnalysis *)local_500);
  local_3d0.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis =
       (_func_int **)&PTR_hasPointsTo_0011d798;
  std::
  unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
  ::~unique_ptr(&local_3d0._builder);
  if (local_3d0.PTA._M_t.
      super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
      ._M_t.
      super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
      .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>)0x0
     ) {
    (**(code **)(*(long *)local_3d0.PTA._M_t.
                          super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                          .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl + 8
                ))();
  }
  local_3d0.PTA._M_t.
  super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>.
  _M_t.
  super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
  .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl =
       (__uniq_ptr_data<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>,_true,_true>
        )(__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>)
         0x0;
  dg::LLVMPointerAnalysis::~LLVMPointerAnalysis(&local_3d0.super_LLVMPointerAnalysis);
  iVar5 = 0;
LAB_0010ef94:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)&local_558);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_520);
  SlicerOptions::~SlicerOptions(&local_2a0);
  return iVar5;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-dda-dump", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    debug::TimeMeasure tm;

    DGLLVMPointerAnalysis PTA(M.get(), options.dgOptions.PTAOptions);

    tm.start();
    PTA.run();

    tm.stop();
    tm.report("INFO: Pointer analysis took");

    tm.start();
    LLVMDataDependenceAnalysis DDA(M.get(), &PTA, options.dgOptions.DDAOptions);
    if (graph_only) {
        DDA.buildGraph();
    } else {
        DDA.run();
    }
    tm.stop();
    tm.report("INFO: Data dependence analysis took");

    if (dump_c_lines) {
#if (LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 7)
        llvm::errs() << "WARNING: Variables names matching is not supported "
                        "for LLVM older than 3.7\n";
#else
        valuesToVars = allocasToVars(*M);
#endif // LLVM > 3.6
        if (valuesToVars.empty()) {
            llvm::errs() << "WARNING: No debugging information found, "
                         << "the C lines output will be corrupted\n";
        }
    }

    dumpDefs(&DDA, todot);

    return 0;
}